

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<char>::CompositeATN(CompositeATN<char> *this,Grammar<char> *grammar)

{
  bool bVar1;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *this_00;
  reference __args;
  CATNMachine<char> local_68;
  reference local_48;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *__range2;
  Grammar<char> *grammar_local;
  CompositeATN<char> *this_local;
  
  this->_vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_00279c88;
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>_>
  ::unordered_map(&this->m_dict);
  this_00 = Grammar<char>::get_machines(grammar);
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
           ::begin(this_00);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         *)&p);
    if (!bVar1) break;
    __args = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
             ::operator*(&__end0);
    local_48 = __args;
    CATNMachine<char>::CATNMachine(&local_68,&__args->second);
    std::
    unordered_map<Centaurus::Identifier,Centaurus::CATNMachine<char>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>>>
    ::emplace<Centaurus::Identifier_const&,Centaurus::CATNMachine<char>>
              ((unordered_map<Centaurus::Identifier,Centaurus::CATNMachine<char>,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>>>
                *)&this->m_dict,&__args->first,&local_68);
    CATNMachine<char>::~CATNMachine(&local_68);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

CompositeATN(const Grammar<TCHAR>& grammar)
    {
        for (const auto& p : grammar.get_machines())
        {
            m_dict.emplace(p.first, CATNMachine<TCHAR>(p.second));
        }
    }